

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

Data * QNetworkHeadersPrivate::fromHttpDate(QByteArrayView value)

{
  char *pcVar1;
  Data DVar2;
  Data DVar3;
  char cVar4;
  void *pvVar5;
  QDateTime *pQVar6;
  void *in_RDX;
  storage_type *psVar7;
  Data *this;
  int iVar8;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QStringView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  int day;
  int year;
  undefined4 uStack_8c;
  QTime local_84;
  QDate local_80;
  int second;
  int minute;
  int hour;
  Data local_68;
  DateFormat DStack_60;
  storage_type_conflict *local_58;
  Data local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  QVar9.m_data = value.m_data;
  this = (Data *)value.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < (long)QVar9.m_data) {
    pvVar5 = memchr(in_RDX,0x2c,(size_t)QVar9.m_data);
    if (pvVar5 != (void *)0x0) {
      iVar8 = (int)pvVar5 - (int)in_RDX;
      goto LAB_0019e6e2;
    }
  }
  iVar8 = -1;
LAB_0019e6e2:
  this->d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::QDateTime((QDateTime *)&this->s);
  if (iVar8 == 3) {
    local_48._0_4_ = 0xaaaaaaaa;
    _year = (undefined1 *)CONCAT44(uStack_8c,0xaaaaaaaa);
    hour = -0x55555556;
    minute = -0x55555556;
    second = -0x55555556;
    iVar8 = __isoc99_sscanf();
    if (iVar8 == 6) {
      if ((byte)local_48._0_1_ - 0x41 < 0x13) {
        pQVar6 = (QDateTime *)
                 (*(code *)(&DAT_00261e24 +
                           *(int *)(&DAT_00261e24 + (ulong)((byte)local_48._0_1_ - 0x41) * 4)))();
        return (Data *)pQVar6;
      }
      QDate::QDate(&local_80,year,0,-0x55555556);
      QTime::QTime(&local_84,hour,minute,second,0);
      QDateTime::QDateTime((QDateTime *)&local_68,local_80.jd,local_84.mds,1);
      DVar2.d = *(QTimeZonePrivate **)this;
      *this = local_68;
      local_68.d = DVar2.d;
      QDateTime::~QDateTime((QDateTime *)&local_68.s);
    }
  }
  else if (iVar8 == -1) {
    QVar9.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar9);
    QVar10.m_data = local_58;
    QVar10.m_size = (qsizetype)&local_48;
    QDateTime::fromString(QVar10,DStack_60);
    DVar2.d = *(QTimeZonePrivate **)this;
    *this = local_48;
    local_48.d = DVar2.d;
    QDateTime::~QDateTime((QDateTime *)&local_48.s);
    if ((QArrayData *)local_68.d != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_68.d = *(int *)local_68.d + -1;
      UNLOCK();
      if (*(int *)local_68.d == 0) {
        QArrayData::deallocate((QArrayData *)local_68.d,2,0x10);
      }
    }
  }
  else {
    _year = &DAT_aaaaaaaaaaaaaaaa;
    QLocale::QLocale((QLocale *)&year,1,0,0);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    psVar7 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar7 + (long)in_RDX + (long)iVar8 + 3;
      psVar7 = psVar7 + 1;
    } while (*pcVar1 != '\0');
    QVar11.m_data = psVar7;
    QVar11.m_size = (qsizetype)&local_48;
    QString::fromLatin1(QVar11);
    QVar12.m_data = (storage_type *)0x18;
    QVar12.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar12);
    DVar3 = local_68;
    QLocale::toDateTime((QString *)&local_68,(QString *)&year,(int)&local_48);
    DVar2.d = *(QTimeZonePrivate **)this;
    this->d = (QTimeZonePrivate *)local_68;
    local_68.d = DVar2.d;
    QDateTime::~QDateTime((QDateTime *)&local_68.s);
    if ((QArrayData *)DVar3.d != (QArrayData *)0x0) {
      LOCK();
      *(int *)DVar3.d = *(int *)DVar3.d + -1;
      UNLOCK();
      if (*(int *)DVar3.d == 0) {
        QArrayData::deallocate((QArrayData *)DVar3.d,2,0x10);
      }
    }
    if ((QArrayData *)local_48.d != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_48.d = *(int *)local_48.d + -1;
      UNLOCK();
      if (*(int *)local_48.d == 0) {
        QArrayData::deallocate((QArrayData *)local_48.d,2,0x10);
      }
    }
    QLocale::~QLocale((QLocale *)&year);
  }
  cVar4 = QDateTime::isValid();
  if (cVar4 != '\0') {
    local_68 = (Data)0x2;
    QDateTime::setTimeZone(this,&local_68,1);
    QTimeZone::~QTimeZone((QTimeZone *)&local_68.s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QNetworkHeadersPrivate::fromHttpDate(QByteArrayView value)
{
    // HTTP dates have three possible formats:
    //  RFC 1123/822      -   ddd, dd MMM yyyy hh:mm:ss "GMT"
    //  RFC 850           -   dddd, dd-MMM-yy hh:mm:ss "GMT"
    //  ANSI C's asctime  -   ddd MMM d hh:mm:ss yyyy
    // We only handle them exactly. If they deviate, we bail out.

    int pos = value.indexOf(',');
    QDateTime dt;
#if QT_CONFIG(datestring)
    if (pos == -1) {
        // no comma -> asctime(3) format
        dt = QDateTime::fromString(QString::fromLatin1(value), Qt::TextDate);
    } else {
        // Use sscanf over QLocal/QDateTimeParser for speed reasons. See the
        // Qt WebKit performance benchmarks to get an idea.
        if (pos == 3) {
            char month_name[4];
            int day, year, hour, minute, second;
#ifdef Q_CC_MSVC
            // Use secure version to avoid compiler warning
            if (sscanf_s(value.constData(), "%*3s, %d %3s %d %d:%d:%d 'GMT'", &day, month_name, 4, &year, &hour, &minute, &second) == 6)
#else
            // The POSIX secure mode is %ms (which allocates memory), too bleeding edge for now
            // In any case this is already safe as field width is specified.
            if (sscanf(value.constData(), "%*3s, %d %3s %d %d:%d:%d 'GMT'", &day, month_name, &year, &hour, &minute, &second) == 6)
#endif
                dt = QDateTime(QDate(year, name_to_month(month_name), day), QTime(hour, minute, second));
        } else {
            QLocale c = QLocale::c();
            // eat the weekday, the comma and the space following it
            QString sansWeekday = QString::fromLatin1(value.constData() + pos + 2);
            // must be RFC 850 date
            dt = c.toDateTime(sansWeekday, "dd-MMM-yy hh:mm:ss 'GMT'"_L1);
        }
    }
#endif // datestring

    if (dt.isValid())
        dt.setTimeZone(QTimeZone::UTC);
    return dt;
}